

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::
BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,151>::BreitWignerLValue,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,151>::BreitWignerLValue,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  ListRecord *pLVar2;
  BreitWignerLValue *lvalue;
  ListRecord *this_00;
  undefined1 local_60 [48];
  
  local_60._24_8_ = ZEXT18((byte)this[0x10]);
  local_60._8_8_ =
       SEXT48((int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 3) * 0x38e38e39);
  local_60._0_8_ = SEXT48(*(int *)(this + 0x14));
  local_60._16_8_ = 0;
  auVar1 = *(undefined1 (*) [16])this;
  local_60._40_4_ = auVar1._0_4_;
  local_60._32_8_ = auVar1._8_8_;
  local_60._44_4_ = auVar1._4_4_;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  pLVar2 = *(ListRecord **)(this + 0x20);
  for (this_00 = *(ListRecord **)(this + 0x18); this_00 != pLVar2; this_00 = this_00 + 1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->SPI(), this->AP(),
                 this->LAD(), 0,
                 this->NLS(), this->NLSC() ).print( it, MAT, MF, MT );
  for ( const auto& lvalue : this->lvalues_ ) {

    lvalue.print( it, MAT, MF, MT );
  }
}